

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  Fts5Tokenizer *__s;
  char *pcVar2;
  char **ppcVar3;
  int iVar4;
  PorterTokenizer *p;
  void *pUserdata;
  undefined8 local_40;
  Fts5Tokenizer **local_38;
  
  local_40 = 0;
  if (nArg < 1) {
    pcVar2 = "unicode61";
  }
  else {
    pcVar2 = *azArg;
  }
  local_38 = ppOut;
  iVar1 = sqlite3_initialize();
  iVar4 = 7;
  if (iVar1 == 0) {
    __s = (Fts5Tokenizer *)sqlite3Malloc(0xa0);
    if (__s != (Fts5Tokenizer *)0x0) {
      iVar4 = 0;
      memset(__s,0,0xa0);
      iVar1 = (**(code **)((long)pCtx + 0x10))(pCtx,pcVar2,&local_40,__s);
      if (iVar1 == 0) {
        iVar1 = nArg + -1;
        if (nArg < 1) {
          iVar1 = 0;
        }
        ppcVar3 = (char **)0x0;
        if (iVar1 != 0) {
          ppcVar3 = azArg + 1;
        }
        iVar1 = (**(code **)__s)(local_40,ppcVar3,iVar1,__s + 0x18);
        if (iVar1 == 0) goto LAB_001d7fec;
      }
      if (*(long *)(__s + 0x18) != 0) {
        (**(code **)(__s + 8))();
      }
      sqlite3_free(__s);
      iVar4 = iVar1;
    }
  }
  __s = (Fts5Tokenizer *)0x0;
LAB_001d7fec:
  *local_38 = __s;
  return iVar4;
}

Assistant:

static int fts5PorterCreate(
  void *pCtx, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer(pApi, zBase, &pUserdata, &pRet->tokenizer);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **azArg2 = (nArg2 ? &azArg[1] : 0);
    rc = pRet->tokenizer.xCreate(pUserdata, azArg2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}